

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5600a9::Nrom_is_cpu_address_in_range_Test::~Nrom_is_cpu_address_in_range_Test
          (Nrom_is_cpu_address_in_range_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Nrom, is_cpu_address_in_range) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> rom = RomFactory::from_bytes(ss);

    EXPECT_TRUE(rom->is_cpu_address_in_range(0x6000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0x7FFFu));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0x8000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xC000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xFFFFu));

    EXPECT_FALSE(rom->is_cpu_address_in_range(0x0000u));
    EXPECT_FALSE(rom->is_cpu_address_in_range(0x5FFFu));
}